

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

APInt __thiscall llvm::APInt::udiv(APInt *this,APInt *RHS)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong val;
  APInt *in_RDX;
  undefined8 extraout_RDX;
  undefined8 uVar5;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  uint numBits;
  uint lhsWords;
  APInt AVar6;
  
  numBits = RHS->BitWidth;
  if (numBits != in_RDX->BitWidth) {
    __assert_fail("BitWidth == RHS.BitWidth && \"Bit widths must be the same\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x5fb,"APInt llvm::APInt::udiv(const APInt &) const");
  }
  if (numBits < 0x41) {
    if ((in_RDX->U).VAL == 0) {
      __assert_fail("RHS.U.VAL != 0 && \"Divide by zero?\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                    ,0x5ff,"APInt llvm::APInt::udiv(const APInt &) const");
    }
    val = (RHS->U).VAL / (in_RDX->U).VAL;
  }
  else {
    uVar2 = countLeadingZerosSlowCase(RHS);
    uVar3 = countLeadingZerosSlowCase(in_RDX);
    if (numBits == uVar3) {
      __assert_fail("rhsWords && \"Divided by zero???\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                    ,0x607,"APInt llvm::APInt::udiv(const APInt &) const");
    }
    if (numBits != uVar2) {
      if (numBits - uVar3 == 1) {
        APInt(this,RHS);
        uVar5 = extraout_RDX_00;
        goto LAB_00143561;
      }
      lhsWords = (uint)((ulong)(numBits - uVar2) + 0x3f >> 6);
      uVar2 = (uint)((ulong)(numBits - uVar3) + 0x3f >> 6);
      if ((uVar2 <= lhsWords) && (iVar4 = compare(RHS,in_RDX), -1 < iVar4)) {
        bVar1 = operator==(RHS,in_RDX);
        if (bVar1) {
          numBits = RHS->BitWidth;
          val = 1;
        }
        else {
          numBits = RHS->BitWidth;
          if (lhsWords != 1) {
            APInt(this,numBits,0,false);
            divide((RHS->U).pVal,lhsWords,(in_RDX->U).pVal,uVar2,(this->U).pVal,(WordType *)0x0);
            uVar5 = extraout_RDX_01;
            goto LAB_00143561;
          }
          val = *(RHS->U).pVal / *(in_RDX->U).pVal;
        }
        goto LAB_0014355a;
      }
    }
    val = 0;
  }
LAB_0014355a:
  APInt(this,numBits,val,false);
  uVar5 = extraout_RDX;
LAB_00143561:
  AVar6._8_8_ = uVar5;
  AVar6.U.pVal = (uint64_t *)this;
  return AVar6;
}

Assistant:

APInt APInt::udiv(const APInt &RHS) const {
  assert(BitWidth == RHS.BitWidth && "Bit widths must be the same");

  // First, deal with the easy case
  if (isSingleWord()) {
    assert(RHS.U.VAL != 0 && "Divide by zero?");
    return APInt(BitWidth, U.VAL / RHS.U.VAL);
  }

  // Get some facts about the LHS and RHS number of bits and words
  unsigned lhsWords = getNumWords(getActiveBits());
  unsigned rhsBits  = RHS.getActiveBits();
  unsigned rhsWords = getNumWords(rhsBits);
  assert(rhsWords && "Divided by zero???");

  // Deal with some degenerate cases
  if (!lhsWords)
    // 0 / X ===> 0
    return APInt(BitWidth, 0);
  if (rhsBits == 1)
    // X / 1 ===> X
    return *this;
  if (lhsWords < rhsWords || this->ult(RHS))
    // X / Y ===> 0, iff X < Y
    return APInt(BitWidth, 0);
  if (*this == RHS)
    // X / X ===> 1
    return APInt(BitWidth, 1);
  if (lhsWords == 1) // rhsWords is 1 if lhsWords is 1.
    // All high words are zero, just use native divide
    return APInt(BitWidth, this->U.pVal[0] / RHS.U.pVal[0]);

  // We have to compute it the hard way. Invoke the Knuth divide algorithm.
  APInt Quotient(BitWidth, 0); // to hold result.
  divide(U.pVal, lhsWords, RHS.U.pVal, rhsWords, Quotient.U.pVal, nullptr);
  return Quotient;
}